

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TextureSwizzle::FunctionalTest::fillSourceTexture
          (FunctionalTest *this,size_t format_idx,size_t target_idx)

{
  int iVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar6;
  ulong local_50;
  size_t i;
  bool result;
  Functions *gl;
  _texture_format *format;
  GLenum target;
  size_t target_idx_local;
  size_t format_idx_local;
  FunctionalTest *this_local;
  long lVar5;
  
  iVar1 = *(int *)(texture_targets + target_idx * 0x30 + 0x28);
  lVar6 = format_idx * 0x78;
  pRVar4 = deqp::Context::getRenderContext((this->super_SmokeTest).super_TestCase.m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  i._7_1_ = true;
  (**(code **)(lVar5 + 0xb8))(iVar1,(this->super_SmokeTest).m_source_tex_id);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xfc2);
  if (iVar1 == 0xde0) {
    (**(code **)(lVar5 + 0x13b0))
              (0xde0,0,0,1,*(undefined4 *)(texture_formats + lVar6 + 8),
               *(undefined4 *)(texture_formats + lVar6 + 0xc),
               *(undefined8 *)(texture_formats + lVar6 + 0x60));
    dVar3 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar3,"TexSubImage1D",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                    ,0xfca);
    goto LAB_00e1dd8e;
  }
  if (iVar1 != 0xde1) {
    if (iVar1 == 0x806f) {
LAB_00e1dbfe:
      (**(code **)(lVar5 + 0x13c0))
                (iVar1,0,0,0,0,1,1,1,*(undefined4 *)(texture_formats + lVar6 + 8),
                 *(undefined4 *)(texture_formats + lVar6 + 0xc),
                 *(undefined8 *)(texture_formats + lVar6 + 0x60));
      dVar3 = (**(code **)(lVar5 + 0x800))();
      glu::checkError(dVar3,"TexSubImage3D",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                      ,0xfdb);
      goto LAB_00e1dd8e;
    }
    if (iVar1 != 0x84f5) {
      if (iVar1 == 0x8513) {
        for (local_50 = 0; local_50 < 6; local_50 = local_50 + 1) {
          (**(code **)(lVar5 + 0x13b8))
                    ((&cube_map_faces)[local_50],0,0,0,1,1,
                     *(undefined4 *)(texture_formats + lVar6 + 8),
                     *(undefined4 *)(texture_formats + lVar6 + 0xc),
                     *(undefined8 *)(texture_formats + lVar6 + 0x60));
          dVar3 = (**(code **)(lVar5 + 0x800))();
          glu::checkError(dVar3,"TexSubImage2D",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                          ,0xfe4);
        }
        goto LAB_00e1dd8e;
      }
      if (iVar1 != 0x8c18) {
        if (iVar1 != 0x8c1a) {
          if ((iVar1 != 0x9100) && (iVar1 != 0x9102)) {
            this_00 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (this_00,"Invalid enum",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                       ,0xff0);
            __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          i._7_1_ = fillMSTexture(this,format_idx,target_idx);
          goto LAB_00e1dd8e;
        }
        goto LAB_00e1dbfe;
      }
    }
  }
  (**(code **)(lVar5 + 0x13b8))
            (iVar1,0,0,0,1,1,*(undefined4 *)(texture_formats + lVar6 + 8),
             *(undefined4 *)(texture_formats + lVar6 + 0xc),
             *(undefined8 *)(texture_formats + lVar6 + 0x60));
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"TexSubImage2D",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xfd3);
LAB_00e1dd8e:
  (**(code **)(lVar5 + 0xb8))(iVar1,0);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xff6);
  return i._7_1_;
}

Assistant:

bool FunctionalTest::fillSourceTexture(size_t format_idx, size_t target_idx)
{
	const glw::GLenum	  target = texture_targets[target_idx].m_target;
	const _texture_format& format = texture_formats[format_idx];

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Result */
	bool result = true;

	/* Bind texture */
	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Attach texture */
	switch (target)
	{
	case GL_TEXTURE_1D:
		gl.texSubImage1D(target, 0 /* level */, 0 /* x */, m_width, format.m_format, format.m_type,
						 format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage1D");

		break;

	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D:
	case GL_TEXTURE_RECTANGLE:
		gl.texSubImage2D(target, 0 /* level */, 0 /* x */, 0 /* y */, m_width, m_height, format.m_format, format.m_type,
						 format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");

		break;

	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.texSubImage3D(target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, m_width, m_height, m_depth,
						 format.m_format, format.m_type, format.m_source_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage3D");

		break;

	case GL_TEXTURE_CUBE_MAP:
		for (size_t i = 0; i < n_cube_map_faces; ++i)
		{
			gl.texSubImage2D(cube_map_faces[i], 0 /* level */, 0 /* x */, 0 /* y */, m_width, m_height, format.m_format,
							 format.m_type, format.m_source_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TexSubImage2D");
		}

		break;

	case GL_TEXTURE_2D_MULTISAMPLE:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
		result = fillMSTexture(format_idx, target_idx);

		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Unbind */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Done */
	return result;
}